

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::DecadeOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  long lVar3;
  date_t *result_data_00;
  idx_t iVar4;
  void *dataptr_00;
  ValidityMask *pVVar5;
  SelectionVector *sel_vector;
  ulong in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar6;
  date_t *ldata_3;
  long *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  date_t *ldata_2;
  long *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  date_t *ldata_1;
  long *result_data_1;
  date_t *ldata;
  long *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  SelectionVector *in_stack_fffffffffffffe68;
  UnifiedVectorFormat *in_stack_fffffffffffffe70;
  date_t input_00;
  Vector *in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffe90;
  optional_idx *in_stack_fffffffffffffea0;
  UnifiedVectorFormat *count_00;
  long *in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  undefined1 uVar8;
  long *plVar7;
  void *in_stack_fffffffffffffeb8;
  ValidityMask *in_stack_fffffffffffffec0;
  ValidityMask *in_stack_fffffffffffffec8;
  idx_t in_stack_fffffffffffffed0;
  long *in_stack_fffffffffffffed8;
  date_t *in_stack_fffffffffffffee0;
  date_t *ldata_00;
  UnifiedVectorFormat *in_stack_ffffffffffffff20;
  idx_t in_stack_ffffffffffffff28;
  Vector *in_stack_ffffffffffffff30;
  UnifiedVectorFormat local_c0;
  SelectionVector *local_78;
  date_t *local_70;
  long *local_68;
  Vector *local_60;
  optional_idx local_58;
  date_t *local_50;
  date_t *local_48;
  int32_t local_3c;
  date_t *local_38;
  long *local_30;
  char local_22;
  byte local_21;
  undefined8 local_18;
  Vector *local_10;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffe88 >> 0x38);
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
    local_48 = (date_t *)FlatVector::GetData<long>((Vector *)0x1fa8441);
    result_data_00 = FlatVector::GetData<duckdb::date_t>((Vector *)0x1fa8456);
    ldata_00 = local_48;
    local_50 = result_data_00;
    FlatVector::Validity((Vector *)0x1fa849b);
    FlatVector::Validity((Vector *)0x1fa84b0);
    ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::DecadeOperator>>
              (ldata_00,(long *)result_data_00,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)uVar8);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    input_00.days = (int32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffea8 >> 0x38);
    local_30 = ConstantVector::GetData<long>((Vector *)0x1fa8386);
    local_38 = ConstantVector::GetData<duckdb::date_t>((Vector *)0x1fa839b);
    bVar2 = ConstantVector::IsNull((Vector *)0x1fa83b0);
    if (bVar2) {
      ConstantVector::SetNull(in_stack_fffffffffffffeb0,(bool)uVar8);
    }
    else {
      ConstantVector::SetNull(in_stack_fffffffffffffeb0,(bool)uVar8);
      local_3c = local_38->days;
      ConstantVector::Validity(local_10);
      lVar3 = GenericUnaryWrapper::
              Operation<duckdb::DatePart::PartOperator<duckdb::DatePart::DecadeOperator>,duckdb::date_t,long>
                        (input_00,(ValidityMask *)in_stack_fffffffffffffe68,
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
      *local_30 = lVar3;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_58 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar2 = optional_idx::IsValid(&local_58);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex(in_stack_fffffffffffffea0),
         iVar4 * 2 < local_18 || iVar4 * 2 - local_18 == 0)) {
        local_60 = DictionaryVector::Child((Vector *)0x1fa8558);
        VVar1 = Vector::GetVectorType(local_60);
        if (VVar1 == FLAT_VECTOR) {
          local_68 = FlatVector::GetData<long>((Vector *)0x1fa8582);
          local_70 = FlatVector::GetData<duckdb::date_t>((Vector *)0x1fa8597);
          plVar7 = local_68;
          dataptr_00 = (void *)optional_idx::GetIndex(in_stack_fffffffffffffea0);
          uVar8 = (undefined1)((ulong)plVar7 >> 0x38);
          pVVar5 = FlatVector::Validity((Vector *)0x1fa85d8);
          FlatVector::Validity((Vector *)0x1fa85ea);
          ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::DecadeOperator>>
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffec8,pVVar5,dataptr_00,(bool)uVar8);
          local_78 = DictionaryVector::SelVector((Vector *)0x1fa862a);
          optional_idx::GetIndex(in_stack_fffffffffffffea0);
          Vector::Dictionary(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                             (idx_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          return;
        }
      }
    }
    count_00 = &local_c0;
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe70);
    Vector::ToUnifiedFormat
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    Vector::SetVectorType(in_stack_fffffffffffffe90,vector_type_p);
    FlatVector::GetData<long>((Vector *)0x1fa86d2);
    UnifiedVectorFormat::GetData<duckdb::date_t>(&local_c0);
    pVVar5 = &local_c0.validity;
    sel_vector = (SelectionVector *)FlatVector::Validity((Vector *)0x1fa873d);
    uVar6 = local_21 & 1;
    ExecuteLoop<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::DecadeOperator>>
              ((date_t *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(idx_t)count_00,
               sel_vector,pVVar5,(ValidityMask *)local_c0.sel,in_stack_fffffffffffffec0,
               (bool)local_18._7_1_);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar6));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}